

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_2::AddPrimitiveVariableForThisAndOther
               (string_view this_variable_name,string_view other_variable_name,
               FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               create_value,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar1;
  AlphaNum *b;
  VoidPtr c;
  AlphaNum local_1d8;
  AlphaNum local_1a8;
  AlphaNum local_178;
  string local_148;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  string local_88;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  VoidPtr local_38;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  create_value_local;
  string_view other_variable_name_local;
  string_view this_variable_name_local;
  
  create_value_local.ptr_ = (VoidPtr)create_value.invoker_;
  c = create_value.ptr_;
  other_variable_name_local._M_str = (char *)this_variable_name._M_len;
  b = (AlphaNum *)other_variable_name._M_str;
  create_value_local.invoker_ =
       (Invoker<std::__cxx11::basic_string<char>,_std::basic_string_view<char>_>)
       other_variable_name._M_len;
  local_38 = c;
  other_variable_name_local._M_len = (size_t)b;
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[5]> *)0xc259cc);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_b8,pbVar1);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_e8,"_");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_88,(lts_20250127 *)&local_b8,&local_e8,b);
  local_68 = (basic_string_view<char,_std::char_traits<char>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_88);
  absl::lts_20250127::
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(&local_58,
               (FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                *)&local_38,local_68);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,
                      (key_arg<std::basic_string_view<char>_> *)&other_variable_name_local._M_str);
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_88);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_178,"other.get");
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[17]> *)0xaa4e7b);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1a8,pbVar1);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1d8,"()");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_148,(lts_20250127 *)&local_178,&local_1a8,&local_1d8,(AlphaNum *)c.obj);
  local_128 = (basic_string_view<char,_std::char_traits<char>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_148);
  absl::lts_20250127::
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(&local_118,
               (FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                *)&local_38,local_128);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,
                      (key_arg<std::basic_string_view<char>_> *)&create_value_local.invoker_);
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_148);
  return;
}

Assistant:

void AddPrimitiveVariableForThisAndOther(
    absl::string_view this_variable_name, absl::string_view other_variable_name,
    absl::FunctionRef<std::string(absl::string_view)> create_value,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)[this_variable_name] =
      create_value(absl::StrCat((*variables)["name"], "_"));
  (*variables)[other_variable_name] = create_value(
      absl::StrCat("other.get", (*variables)["capitalized_name"], "()"));
}